

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b8a13::CAPIBuildSystemFrontendDelegate::determinedRuleNeedsToRun
          (CAPIBuildSystemFrontendDelegate *this,Rule *ruleNeedingToRun,RunReason reason,
          Rule *inputRule)

{
  _func_void_void_ptr_llb_build_key_t_ptr_llb_rule_run_reason_t_llb_build_key_t_ptr *p_Var1;
  void *pvVar2;
  llb_rule_run_reason_t lVar3;
  CAPIBuildKey *this_00;
  CAPIBuildKey *this_01;
  undefined1 local_78 [8];
  BuildKey inputKey;
  llb_build_key_t *input;
  llb_build_key_t *needsToRun;
  BuildKey key;
  Rule *inputRule_local;
  RunReason reason_local;
  Rule *ruleNeedingToRun_local;
  CAPIBuildSystemFrontendDelegate *this_local;
  
  if ((this->cAPIDelegate).determined_rule_needs_to_run !=
      (_func_void_void_ptr_llb_build_key_t_ptr_llb_rule_run_reason_t_llb_build_key_t_ptr *)0x0) {
    key.key.key.field_2._8_8_ = inputRule;
    llbuild::buildsystem::BuildKey::fromData((BuildKey *)&needsToRun,&ruleNeedingToRun->key);
    this_00 = (CAPIBuildKey *)operator_new(0x38);
    CAPIBuildKey::CAPIBuildKey(this_00,(BuildKey *)&needsToRun);
    if (key.key.key.field_2._8_8_ == 0) {
      inputKey.key.key.field_2._8_8_ = 0;
    }
    else {
      llbuild::buildsystem::BuildKey::fromData
                ((BuildKey *)local_78,(KeyType *)(key.key.key.field_2._8_8_ + 8));
      this_01 = (CAPIBuildKey *)operator_new(0x38);
      CAPIBuildKey::CAPIBuildKey(this_01,(BuildKey *)local_78);
      inputKey.key.key.field_2._8_8_ = this_01;
      llbuild::buildsystem::BuildKey::~BuildKey((BuildKey *)local_78);
    }
    p_Var1 = (this->cAPIDelegate).determined_rule_needs_to_run;
    pvVar2 = (this->cAPIDelegate).context;
    lVar3 = convertRunReason(reason);
    (*p_Var1)(pvVar2,(llb_build_key_t *)this_00,lVar3,
              (llb_build_key_t *)inputKey.key.key.field_2._8_8_);
    llb_build_key_destroy((llb_build_key_t *)this_00);
    if (inputKey.key.key.field_2._8_8_ != 0) {
      llb_build_key_destroy((llb_build_key_t *)inputKey.key.key.field_2._8_8_);
    }
    llbuild::buildsystem::BuildKey::~BuildKey((BuildKey *)&needsToRun);
  }
  return;
}

Assistant:

virtual void determinedRuleNeedsToRun(core::Rule* ruleNeedingToRun, core::Rule::RunReason reason, core::Rule* inputRule) override {
    if (cAPIDelegate.determined_rule_needs_to_run) {
      auto key = BuildKey::fromData(ruleNeedingToRun->key);
      auto needsToRun = (llb_build_key_t *)new CAPIBuildKey(key);
      llb_build_key_t * input;
      if (inputRule) {
        auto inputKey = BuildKey::fromData(inputRule->key);
        input = (llb_build_key_t *)new CAPIBuildKey(inputKey);
      } else {
        input = nullptr;
      }
      cAPIDelegate.determined_rule_needs_to_run(cAPIDelegate.context, needsToRun, convertRunReason(reason), input);
      llb_build_key_destroy(needsToRun);
      if (input) {
        llb_build_key_destroy(input);
      }
    }
  }